

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void parse_version(htsFormat *fmt,uchar *u,uchar *ulim)

{
  int iVar1;
  ushort **ppuVar2;
  uchar *__nptr;
  uchar *local_38;
  char *s;
  char *slim;
  char *str;
  uchar *ulim_local;
  uchar *u_local;
  htsFormat *fmt_local;
  
  (fmt->version).minor = -1;
  (fmt->version).major = -1;
  local_38 = u;
  while ((local_38 < ulim &&
         (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(char)*local_38] & 0x800) != 0))) {
    local_38 = local_38 + 1;
  }
  if (local_38 < ulim) {
    iVar1 = atoi((char *)u);
    (fmt->version).major = (short)iVar1;
    if (*local_38 == '.') {
      __nptr = local_38 + 1;
      local_38 = __nptr;
      while ((local_38 < ulim &&
             (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(char)*local_38] & 0x800) != 0))) {
        local_38 = local_38 + 1;
      }
      if (local_38 < ulim) {
        iVar1 = atoi((char *)__nptr);
        (fmt->version).minor = (short)iVar1;
      }
    }
    else {
      (fmt->version).minor = 0;
    }
  }
  return;
}

Assistant:

static void
parse_version(htsFormat *fmt, const unsigned char *u, const unsigned char *ulim)
{
    const char *str  = (const char *) u;
    const char *slim = (const char *) ulim;
    const char *s;

    fmt->version.major = fmt->version.minor = -1;

    for (s = str; s < slim; s++) if (!isdigit(*s)) break;
    if (s < slim) {
        fmt->version.major = atoi(str);
        if (*s == '.') {
            str = &s[1];
            for (s = str; s < slim; s++) if (!isdigit(*s)) break;
            if (s < slim)
                fmt->version.minor = atoi(str);
        }
        else
            fmt->version.minor = 0;
    }
}